

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O0

bool senjo::ParamValue(string *value,char **params,string *next)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  char *local_38;
  char *local_30;
  char *end;
  string *next_local;
  char **params_local;
  string *value_local;
  
  if ((*params != (char *)0x0) &&
     (end = (char *)next, next_local = (string *)params, params_local = (char **)value,
     pcVar2 = NextWord(params), *pcVar2 != '\0')) {
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 0) {
      local_38 = (char *)0x0;
    }
    else {
      pcVar2 = *(char **)next_local;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_38 = strstr(pcVar2,pcVar4);
    }
    local_30 = local_38;
    while( true ) {
      pcVar2 = local_30;
      bVar6 = false;
      if (local_30 != (char *)0x0) {
        lVar3 = std::__cxx11::string::size();
        pcVar4 = local_30;
        bVar6 = false;
        if (pcVar2[lVar3] != '\0') {
          lVar3 = std::__cxx11::string::size();
          iVar1 = isspace((int)pcVar4[lVar3]);
          bVar6 = iVar1 == 0;
        }
      }
      if (!bVar6) break;
      lVar3 = std::__cxx11::string::size();
      local_30 = local_30 + lVar3;
      NextSpace(&local_30);
      pcVar2 = local_30;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_30 = strstr(pcVar2,pcVar4);
    }
    if (local_30 == (char *)0x0) {
      lVar3 = *(long *)next_local;
      sVar5 = strlen(*(char **)next_local);
      local_30 = (char *)(lVar3 + sVar5);
    }
    while( true ) {
      bVar6 = false;
      if (*(char **)next_local < local_30) {
        iVar1 = isspace((int)local_30[-1]);
        bVar6 = iVar1 != 0;
      }
      if (!bVar6) break;
      local_30 = local_30 + -1;
    }
    std::__cxx11::string::assign((char *)params_local,*(ulong *)next_local);
    lVar3 = std::__cxx11::string::size();
    if (lVar3 != 0) {
      lVar3 = std::__cxx11::string::size();
      *(long *)next_local = lVar3 + *(long *)next_local;
      NextWord((char **)next_local);
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool ParamValue(std::string& value, const char*& params,
                              const std::string& next)
{
  if (params && *NextWord(params)) {
    const char* end = next.size() ? strstr(params, next.c_str()) : NULL;
    while (end && end[next.size()] && !isspace(end[next.size()])) {
      NextSpace(end += next.size());
      end = strstr(end, next.c_str());
    }
    if (!end) {
      end = (params + strlen(params));
    }
    while ((end > params) && isspace(end[-1])) {
      --end;
    }
    value.assign(params, (end - params));
    if (value.size()) {
      NextWord(params += value.size());
      return true;
    }
  }
  return false;
}